

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O3

btSoftBody *
btSoftBodyHelpers::CreateFromConvexHull
          (btSoftBodyWorldInfo *worldInfo,btVector3 *vertices,int nvertices,
          bool randomizeConstraints)

{
  int node0;
  int node1;
  int node1_00;
  btSoftBody *this;
  long lVar1;
  long lVar2;
  HullResult hres;
  HullLibrary hlib;
  HullResult local_e0;
  HullLibrary local_90;
  HullDesc local_50;
  
  local_50.mFlags = 1;
  local_50.mVertexStride = 0x10;
  local_50.mNormalEpsilon = 0.001;
  local_e0.m_OutputVertices.m_ownsMemory = true;
  local_e0.m_OutputVertices.m_data = (btVector3 *)0x0;
  local_e0.m_OutputVertices.m_size = 0;
  local_e0.m_OutputVertices.m_capacity = 0;
  local_e0.m_Indices.m_ownsMemory = true;
  local_e0.m_Indices.m_data = (uint *)0x0;
  local_e0.m_Indices.m_size = 0;
  local_e0.m_Indices.m_capacity = 0;
  local_e0.mPolygons = true;
  local_e0.mNumOutputVertices = 0;
  local_e0.mNumFaces = 0;
  local_e0.mNumIndices = 0;
  local_90.m_tris.m_ownsMemory = true;
  local_90.m_tris.m_data = (btHullTriangle **)0x0;
  local_90.m_tris.m_size = 0;
  local_90.m_tris.m_capacity = 0;
  local_90.m_vertexIndexMapping.m_ownsMemory = true;
  local_90.m_vertexIndexMapping.m_data = (int *)0x0;
  local_90.m_vertexIndexMapping.m_size = 0;
  local_90.m_vertexIndexMapping.m_capacity = 0;
  local_50.mVcount = nvertices;
  local_50.mVertices = vertices;
  local_50.mMaxVertices = nvertices;
  HullLibrary::CreateConvexHull(&local_90,&local_50,&local_e0);
  this = (btSoftBody *)btAlignedAllocInternal(0x690,0x10);
  btSoftBody::btSoftBody
            (this,worldInfo,local_e0.mNumOutputVertices,local_e0.m_OutputVertices.m_data,
             (btScalar *)0x0);
  if (0 < (int)local_e0.mNumFaces) {
    lVar2 = 8;
    lVar1 = 0;
    do {
      node0 = *(int *)((long)local_e0.m_Indices.m_data + lVar2 + -8);
      node1 = *(int *)((long)local_e0.m_Indices.m_data + lVar2 + -4);
      node1_00 = *(int *)((long)local_e0.m_Indices.m_data + lVar2);
      if (node0 < node1) {
        btSoftBody::appendLink(this,node0,node1,(Material *)0x0,false);
      }
      if (node1 < node1_00) {
        btSoftBody::appendLink(this,node1,node1_00,(Material *)0x0,false);
      }
      if (node1_00 < node0) {
        btSoftBody::appendLink(this,node1_00,node0,(Material *)0x0,false);
      }
      btSoftBody::appendFace(this,node0,node1,node1_00,(Material *)0x0);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0xc;
    } while (lVar1 < (int)local_e0.mNumFaces);
  }
  HullLibrary::ReleaseResult(&local_90,&local_e0);
  if (randomizeConstraints) {
    btSoftBody::randomizeConstraints(this);
  }
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_90.m_vertexIndexMapping);
  btAlignedObjectArray<btHullTriangle_*>::~btAlignedObjectArray(&local_90.m_tris);
  btAlignedObjectArray<unsigned_int>::~btAlignedObjectArray(&local_e0.m_Indices);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_e0.m_OutputVertices);
  return this;
}

Assistant:

btSoftBody*		btSoftBodyHelpers::CreateFromConvexHull(btSoftBodyWorldInfo& worldInfo,	const btVector3* vertices,
														int nvertices, bool randomizeConstraints)
{
	HullDesc		hdsc(QF_TRIANGLES,nvertices,vertices);
	HullResult		hres;
	HullLibrary		hlib;/*??*/ 
	hdsc.mMaxVertices=nvertices;
	hlib.CreateConvexHull(hdsc,hres);
	btSoftBody*		psb=new btSoftBody(&worldInfo,(int)hres.mNumOutputVertices,
		&hres.m_OutputVertices[0],0);
	for(int i=0;i<(int)hres.mNumFaces;++i)
	{
		const int idx[]={	static_cast<int>(hres.m_Indices[i*3+0]),
							static_cast<int>(hres.m_Indices[i*3+1]),
							static_cast<int>(hres.m_Indices[i*3+2])};
		if(idx[0]<idx[1]) psb->appendLink(	idx[0],idx[1]);
		if(idx[1]<idx[2]) psb->appendLink(	idx[1],idx[2]);
		if(idx[2]<idx[0]) psb->appendLink(	idx[2],idx[0]);
		psb->appendFace(idx[0],idx[1],idx[2]);
	}
	hlib.ReleaseResult(hres);
	if (randomizeConstraints)
	{
		psb->randomizeConstraints();
	}
	return(psb);
}